

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasAkzoNob_ASAi_dns.c
# Opt level: O2

int resB(sunrealtype tt,N_Vector yy,N_Vector yp,N_Vector yyB,N_Vector ypB,N_Vector rrB,
        void *user_dataB)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double *pdVar13;
  double *pdVar14;
  double *pdVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  
  dVar26 = *user_dataB;
  dVar1 = *(double *)((long)user_dataB + 8);
  dVar27 = *(double *)((long)user_dataB + 0x10);
  pdVar13 = *(double **)((long)yy->content + 0x10);
  dVar2 = *pdVar13;
  dVar28 = pdVar13[1];
  dVar31 = pdVar13[5];
  pdVar14 = *(double **)((long)yyB->content + 0x10);
  pdVar15 = *(double **)((long)ypB->content + 0x10);
  dVar3 = *pdVar15;
  dVar29 = dVar2 * dVar2 * dVar2;
  dVar30 = dVar1 / *(double *)((long)user_dataB + 0x20);
  dVar23 = pdVar13[4] * dVar30;
  dVar20 = *(double *)((long)user_dataB + 0x18) * dVar31;
  dVar16 = pdVar14[2];
  dVar17 = pdVar14[3];
  dVar18 = pdVar14[4];
  dVar19 = pdVar14[5];
  dVar4 = *(double *)((long)user_dataB + 0x28);
  dVar5 = *(double *)((long)user_dataB + 0x30);
  dVar22 = pdVar13[2];
  dVar6 = pdVar13[3];
  dVar7 = *pdVar14;
  dVar8 = pdVar14[1];
  dVar9 = pdVar15[1];
  dVar10 = pdVar15[2];
  dVar11 = pdVar15[3];
  dVar12 = pdVar15[4];
  if (dVar28 < 0.0) {
    dVar21 = sqrt(dVar28);
  }
  else {
    dVar21 = SQRT(dVar28);
  }
  dVar24 = dVar6 * dVar6 * dVar27;
  dVar25 = (dVar21 / dVar28) * dVar29 * dVar26 * dVar2;
  dVar29 = dVar26 * dVar29 * dVar21;
  dVar26 = dVar31 * dVar20 * (dVar21 / dVar28);
  dVar31 = dVar27 * dVar2 * dVar6;
  dVar28 = dVar31 * -2.0;
  dVar27 = (dVar7 - dVar16) - dVar17;
  dVar22 = dVar22 * dVar1;
  pdVar13 = *(double **)((long)rrB->content + 0x10);
  *pdVar13 = dVar6 * dVar5 * dVar19 +
             dVar24 * -2.0 * dVar17 +
             (dVar17 - dVar18) * dVar23 +
             dVar16 * (dVar29 * 4.0 + dVar23) +
             (((dVar3 + 1.0) - (dVar29 * 8.0 + dVar23 + dVar24) * dVar7) -
             (dVar29 + dVar29 + dVar24) * dVar8);
  pdVar13[1] = dVar26 * 0.5 * dVar18 +
               dVar25 * 0.5 * dVar16 +
               dVar8 * -(dVar4 + dVar25 * 0.25 + dVar26 * 0.25) + dVar7 * -dVar25 + dVar9;
  pdVar13[2] = (dVar18 + dVar27) * dVar6 * dVar1 + dVar10;
  pdVar13[3] = dVar19 * dVar2 * dVar5 +
               dVar22 * dVar18 +
               (((dVar28 * dVar8 + (dVar28 + dVar22) * dVar7 + dVar11) - dVar16 * dVar22) -
               (dVar31 * 4.0 + dVar22) * dVar17);
  pdVar13[4] = -dVar30 * dVar2 * (dVar27 + dVar18) + dVar12;
  pdVar13[5] = dVar21 * dVar20 * ((dVar18 + dVar18) - dVar8) + -dVar19;
  return 0;
}

Assistant:

static int resB(sunrealtype tt, N_Vector yy, N_Vector yp, N_Vector yyB,
                N_Vector ypB, N_Vector rrB, void* user_dataB)
{
  UserData data;

  sunrealtype y1, y2, y3, y4, y5, y6;

  sunrealtype yB1, yB2, yB3, yB4, yB5, yB6;
  sunrealtype ypB1, ypB2, ypB3, ypB4, ypB5;

  sunrealtype k1, k2, k3, k4;
  sunrealtype K, klA, Ks;

  sunrealtype y2tohalf, y1to3, k2overK, tmp1, tmp2;

  data = (UserData)user_dataB;
  k1   = data->k1;
  k2   = data->k2;
  k3   = data->k3;
  k4   = data->k4;
  K    = data->K;
  klA  = data->klA;
  Ks   = data->Ks;

  y1 = Ith(yy, 1);
  y2 = Ith(yy, 2);
  y3 = Ith(yy, 3);
  y4 = Ith(yy, 4);
  y5 = Ith(yy, 5);
  y6 = Ith(yy, 6);

  yB1 = Ith(yyB, 1);
  yB2 = Ith(yyB, 2);
  yB3 = Ith(yyB, 3);
  yB4 = Ith(yyB, 4);
  yB5 = Ith(yyB, 5);
  yB6 = Ith(yyB, 6);

  ypB1 = Ith(ypB, 1);
  ypB2 = Ith(ypB, 2);
  ypB3 = Ith(ypB, 3);
  ypB4 = Ith(ypB, 4);
  ypB5 = Ith(ypB, 5);

  y2tohalf = sqrt(y2);
  y1to3    = y1 * y1 * y1;
  k2overK  = k2 / K;

  tmp1        = k1 * y1to3 * y2tohalf;
  tmp2        = k3 * y4 * y4;
  Ith(rrB, 1) = 1 + ypB1 - (EIGHT * tmp1 + k2overK * y5 + tmp2) * yB1 -
                (TWO * tmp1 + tmp2) * yB2 + (FOUR * tmp1 + k2overK * y5) * yB3 +
                k2overK * y5 * (yB4 - yB5) - TWO * tmp2 * yB4 + Ks * y4 * yB6;

  tmp1        = k1 * y1 * y1to3 * (y2tohalf / y2);
  tmp2        = k4 * y6 * y6 * (y2tohalf / y2);
  Ith(rrB, 2) = ypB2 - tmp1 * yB1 -
                (QUARTER * tmp1 + QUARTER * tmp2 + klA) * yB2 +
                HALF * tmp1 * yB3 + HALF * tmp2 * yB5;

  Ith(rrB, 3) = ypB3 + k2 * y4 * (yB1 - yB3 - yB4 + yB5);

  tmp1 = k3 * y1 * y4;
  tmp2 = k2 * y3;
  Ith(rrB, 4) = ypB4 + (tmp2 - TWO * tmp1) * yB1 - TWO * tmp1 * yB2 - tmp2 * yB3 -
                (tmp2 + FOUR * tmp1) * yB4 + tmp2 * yB5 + Ks * y1 * yB6;

  Ith(rrB, 5) = ypB5 - k2overK * y1 * (yB1 - yB3 - yB4 + yB5);

  Ith(rrB, 6) = k4 * y6 * y2tohalf * (2 * yB5 - yB2) - yB6;

  return 0;
}